

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O2

void __thiscall QPrintPreviewWidget::setViewMode(QPrintPreviewWidget *this,ViewMode mode)

{
  QPrintPreviewWidgetPrivate *this_00;
  GraphicsView *pGVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  double local_80 [10];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPrintPreviewWidgetPrivate **)(this + 8);
  this_00->viewMode = mode;
  QPrintPreviewWidgetPrivate::layoutPages(this_00);
  if (this_00->viewMode == AllPagesView) {
    pGVar1 = this_00->graphicsView;
    QGraphicsScene::itemsBoundingRect();
    QGraphicsView::fitInView((QRectF *)pGVar1,(AspectRatioMode)local_80);
    this_00->fitting = false;
    this_00->zoomMode = CustomZoom;
    QGraphicsView::transform();
    iVar2 = (**(code **)(*(long *)this_00->printer + 0x20))(this_00->printer,8);
    iVar3 = (**(code **)(*(long *)(this + 0x10) + 0x20))(this + 0x10,8);
    this_00->zoomFactor = (double)((float)iVar2 / (float)iVar3) * local_80[0];
    previewChanged(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00->fitting = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QPrintPreviewWidgetPrivate::_q_fit(this_00,false);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewWidget::setViewMode(ViewMode mode)
{
    Q_D(QPrintPreviewWidget);
    d->viewMode = mode;
    d->layoutPages();
    if (d->viewMode == AllPagesView) {
        d->graphicsView->fitInView(d->scene->itemsBoundingRect(), Qt::KeepAspectRatio);
        d->fitting = false;
        d->zoomMode = QPrintPreviewWidget::CustomZoom;
        d->zoomFactor = d->graphicsView->transform().m11() * (float(d->printer->logicalDpiY()) / logicalDpiY());
        emit previewChanged();
    } else {
        d->fitting = true;
        d->_q_fit();
    }
}